

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

char * emitter_gen_fmt(char *out_fmt,size_t out_size,char *fmt_specifier,emitter_justify_t justify,
                      int width)

{
  undefined4 in_register_0000000c;
  char *format;
  
  if ((int)fmt_specifier == 0) {
    format = "%%-%d%s";
  }
  else {
    if ((int)fmt_specifier == 2) {
      duckdb_je_malloc_snprintf(out_fmt,10,"%%%s",out_size + 1);
      return out_fmt;
    }
    format = "%%%d%s";
  }
  duckdb_je_malloc_snprintf(out_fmt,10,format,CONCAT44(in_register_0000000c,justify));
  return out_fmt;
}

Assistant:

emitter_gen_fmt(char *out_fmt, size_t out_size, const char *fmt_specifier,
    emitter_justify_t justify, int width) {
	size_t written;
	fmt_specifier++;
	if (justify == emitter_justify_none) {
		written = malloc_snprintf(out_fmt, out_size,
		    "%%%s", fmt_specifier);
	} else if (justify == emitter_justify_left) {
		written = malloc_snprintf(out_fmt, out_size,
		    "%%-%d%s", width, fmt_specifier);
	} else {
		written = malloc_snprintf(out_fmt, out_size,
		    "%%%d%s", width, fmt_specifier);
	}
	/* Only happens in case of bad format string, which *we* choose. */
	assert(written <  out_size);
	return out_fmt;
}